

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall pbrt::FloatPtexTexture::ToString_abi_cxx11_(FloatPtexTexture *this)

{
  PtexTextureBase *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  PtexTextureBase::BaseToString_abi_cxx11_(in_RDI);
  StringPrintf<std::__cxx11::string>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return (string *)in_RDI;
}

Assistant:

std::string FloatPtexTexture::ToString() const {
    return StringPrintf("[ FloatPtexTexture %s ]", BaseToString());
}